

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O1

void __thiscall absl::lts_20240722::Status::Status(Status *this,StatusCode code,string_view msg)

{
  undefined4 *puVar1;
  _Head_base<0UL,_absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_*,_false>
  local_30;
  
  this->rep_ = (long)(int)code * 4 + 1;
  if (msg._M_len != 0 && code != kOk) {
    puVar1 = (undefined4 *)operator_new(0x30);
    local_30._M_head_impl =
         (InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
          *)0x0;
    *puVar1 = 1;
    puVar1[1] = code;
    *(undefined4 **)(puVar1 + 2) = puVar1 + 6;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(puVar1 + 2),msg._M_str,msg._M_str + msg._M_len);
    *(InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
      **)(puVar1 + 10) = local_30._M_head_impl;
    local_30._M_head_impl =
         (InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
          *)0x0;
    this->rep_ = (uintptr_t)puVar1;
    std::
    unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
    ::~unique_ptr((unique_ptr<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>,_std::default_delete<absl::lts_20240722::InlinedVector<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>_>_>
                   *)&local_30);
  }
  return;
}

Assistant:

Status::Status(absl::StatusCode code, absl::string_view msg)
    : rep_(CodeToInlinedRep(code)) {
  if (code != absl::StatusCode::kOk && !msg.empty()) {
    rep_ = PointerToRep(new status_internal::StatusRep(code, msg, nullptr));
  }
}